

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O0

void __thiscall QLineEdit::inputMethodEvent(QLineEdit *this,QInputMethodEvent *e)

{
  bool bVar1;
  EchoMode EVar2;
  QLineEditPrivate *pQVar3;
  QLineEditPrivate *in_RSI;
  QLineEdit *in_RDI;
  int in_stack_0000000c;
  QLineEditPrivate *d;
  QInputMethodEvent *in_stack_00000050;
  QWidgetLineControl *in_stack_00000058;
  QWidgetLineControl *in_stack_ffffffffffffffd8;
  undefined1 editing;
  
  pQVar3 = d_func((QLineEdit *)0x5c6981);
  editing = (undefined1)((ulong)pQVar3 >> 0x38);
  EVar2 = echoMode(in_RDI);
  if (EVar2 == PasswordEchoOnEdit) {
    bVar1 = QWidgetLineControl::passwordEchoEditing(in_stack_ffffffffffffffd8);
    if (!bVar1) {
      QLineEditPrivate::updatePasswordEchoEditing(in_RSI,(bool)editing);
      clear(in_RDI);
    }
  }
  QWidgetLineControl::processInputMethodEvent(in_stack_00000058,in_stack_00000050);
  QInputMethodEvent::commitString((QInputMethodEvent *)in_RSI);
  bVar1 = QString::isEmpty((QString *)0x5c69eb);
  if (!bVar1) {
    QWidgetLineControl::complete((QWidgetLineControl *)d,in_stack_0000000c);
  }
  return;
}

Assistant:

void QLineEdit::inputMethodEvent(QInputMethodEvent *e)
{
    Q_D(QLineEdit);

    if (echoMode() == PasswordEchoOnEdit && !d->control->passwordEchoEditing()) {
        // Clear the edit and reset to normal echo mode while entering input
        // method data; the echo mode switches back when the edit loses focus.
        // ### changes a public property, resets current content.
        d->updatePasswordEchoEditing(true);
        clear();
    }

#ifdef QT_KEYPAD_NAVIGATION
    // Focus in if currently in navigation focus on the widget
    // Only focus in on preedits, to allow input methods to
    // commit text as they focus out without interfering with focus
    if (QApplicationPrivate::keypadNavigationEnabled()
        && hasFocus() && !hasEditFocus()
        && !e->preeditString().isEmpty())
        setEditFocus(true);
#endif

    d->control->processInputMethodEvent(e);

#if QT_CONFIG(completer)
    if (!e->commitString().isEmpty())
        d->control->complete(Qt::Key_unknown);
#endif
}